

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

int phr_parse_response(char *buf_start,size_t len,int *minor_version,int *status,char **msg,
                      size_t *msg_len,phr_header *headers,size_t *num_headers,size_t last_len)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int local_3c;
  size_t local_38;
  
  local_38 = *num_headers;
  *minor_version = -1;
  *status = 0;
  *msg = (char *)0x0;
  pcVar7 = buf_start + len;
  *msg_len = 0;
  *num_headers = 0;
  if ((last_len != 0) &&
     (pcVar2 = is_complete(buf_start,pcVar7,last_len,&local_3c), pcVar2 == (char *)0x0)) {
    return local_3c;
  }
  pcVar2 = parse_http_version(buf_start,pcVar7,minor_version,&local_3c);
  if (pcVar2 == (char *)0x0) {
    return local_3c;
  }
  if (*pcVar2 == ' ') {
    lVar4 = (long)pcVar7 - (long)pcVar2;
    pcVar2 = pcVar2 + 1;
    do {
      pcVar6 = pcVar2;
      if (pcVar6 == pcVar7) {
        return -2;
      }
      cVar1 = *pcVar6;
      lVar4 = lVar4 + -1;
      pcVar2 = pcVar6 + 1;
    } while (cVar1 == ' ');
    if (lVar4 < 4) {
      return -2;
    }
    if (0xf5 < (byte)(cVar1 - 0x3aU)) {
      iVar3 = (uint)(byte)(cVar1 - 0x30) * 100;
      *status = iVar3;
      cVar1 = pcVar6[1];
      if (0xf5 < (byte)(cVar1 - 0x3aU)) {
        iVar3 = iVar3 + (uint)(byte)(cVar1 * '\n' + 0x20);
        *status = iVar3;
        if (0xf5 < (byte)(pcVar6[2] - 0x3aU)) {
          *status = iVar3 + (uint)(byte)(pcVar6[2] - 0x30);
          pcVar2 = get_token_to_eol(pcVar6 + 3,pcVar7,msg,msg_len,&local_3c);
          if (pcVar2 == (char *)0x0) {
            return local_3c;
          }
          sVar5 = *msg_len;
          if (sVar5 != 0) {
            pcVar6 = *msg;
            if (*pcVar6 != ' ') {
              return -1;
            }
            do {
              sVar5 = sVar5 - 1;
              pcVar6 = pcVar6 + 1;
              *msg = pcVar6;
              *msg_len = sVar5;
            } while (*pcVar6 == ' ');
          }
          pcVar7 = parse_headers(pcVar2,pcVar7,headers,num_headers,local_38,&local_3c);
          if (pcVar7 != (char *)0x0) {
            return (int)pcVar7 - (int)buf_start;
          }
          return local_3c;
        }
      }
    }
  }
  return -1;
}

Assistant:

int phr_parse_response(const char *buf_start, size_t len, int *minor_version, int *status, const char **msg, size_t *msg_len,
                       struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *minor_version = -1;
    *status = 0;
    *msg = NULL;
    *msg_len = 0;
    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}